

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  undefined **ppuVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  size_t sVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  char *pcVar33;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  bool toPly;
  bool format;
  vector<float,_std::allocator<float>_> c;
  string pixelBounds;
  string pixel;
  string pixelMaterial;
  string renderCoordSys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string logLevel;
  string cropWindow;
  bool local_1659;
  bool local_1619;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1600;
  bool local_15f1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15f0;
  char **local_15e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15b0;
  char local_15a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15a0;
  string local_1598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1578;
  string local_1570;
  string local_1550;
  string local_1530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1510;
  string local_1508;
  vector<float,_std::allocator<float>_> local_14e8;
  string local_14d0;
  string local_14b0;
  string local_1490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1470;
  string local_1468;
  string local_1448;
  string local_1428;
  string local_1408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_13e8;
  string local_13e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c0;
  string local_13a0;
  string local_1380;
  string local_1360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1340;
  string local_1338;
  string local_1318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1298;
  string local_1280;
  string local_1260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  PBRTOptions local_1220;
  _Any_data local_1118;
  code *local_1108;
  code *local_1100;
  _Any_data local_10f8;
  code *local_10e8;
  code *local_10e0;
  _Any_data local_10d8;
  code *local_10c8;
  code *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  code *local_1040;
  _Any_data local_1038;
  code *local_1028;
  code *local_1020;
  _Any_data local_1018;
  code *local_1008;
  code *local_1000;
  _Any_data local_ff8;
  code *local_fe8;
  code *local_fe0;
  _Any_data local_fd8;
  code *local_fc8;
  code *local_fc0;
  _Any_data local_fb8;
  code *local_fa8;
  code *local_fa0;
  _Any_data local_f98;
  code *local_f88;
  code *local_f80;
  _Any_data local_f78;
  code *local_f68;
  code *local_f60;
  _Any_data local_f58;
  code *local_f48;
  code *local_f40;
  _Any_data local_f38;
  code *local_f28;
  code *local_f20;
  _Any_data local_f18;
  code *local_f08;
  code *local_f00;
  _Any_data local_ef8;
  code *local_ee8;
  code *local_ee0;
  _Any_data local_ed8;
  code *local_ec8;
  code *local_ec0;
  _Any_data local_eb8;
  code *local_ea8;
  code *local_ea0;
  _Any_data local_e98;
  code *local_e88;
  code *local_e80;
  _Any_data local_e78;
  code *local_e68;
  code *local_e60;
  _Any_data local_e58;
  code *local_e48;
  code *local_e40;
  _Any_data local_e38;
  code *local_e28;
  code *local_e20;
  undefined1 local_e10 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df0;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_de0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_dd8;
  undefined1 local_dd0 [64];
  undefined1 local_d90 [48];
  undefined1 local_d60 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_d40;
  
  local_1220.imageFile._M_dataplus._M_p = (pointer)&local_1220.imageFile.field_2;
  local_1220.super_BasicPBRTOptions.useGPU = false;
  local_1220.super_BasicPBRTOptions.seed = 0;
  local_1220.super_BasicPBRTOptions.quiet = false;
  local_1220.super_BasicPBRTOptions.disablePixelJitter = false;
  local_1220.super_BasicPBRTOptions.disableWavelengthJitter = false;
  local_1220.super_BasicPBRTOptions.forceDiffuse = false;
  local_1220.super_BasicPBRTOptions.renderingSpace = CameraWorld;
  local_1220.nThreads = 0;
  local_1220.logLevel = Error;
  local_1220.writePartialImages = false;
  local_1220.recordPixelStatistics = false;
  local_1220.pixelSamples.set = false;
  local_1220.gpuDevice.set = false;
  local_1220.quickRender = false;
  local_1220.upgrade = false;
  local_1220.imageFile._M_string_length = 0;
  local_1220.imageFile.field_2._M_local_buf[0] = '\0';
  local_1220.mseReferenceImage._M_dataplus._M_p = (pointer)&local_1220.mseReferenceImage.field_2;
  local_1220.mseReferenceImage._M_string_length = 0;
  local_1220.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_1220.mseReferenceOutput._M_dataplus._M_p = (pointer)&local_1220.mseReferenceOutput.field_2;
  local_1220.mseReferenceOutput._M_string_length = 0;
  local_1220.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_1220.debugStart._M_dataplus._M_p = (pointer)&local_1220.debugStart.field_2;
  local_1220.debugStart._M_string_length = 0;
  local_1220.debugStart.field_2._M_local_buf[0] = '\0';
  local_1220.displayServer._M_dataplus._M_p = (pointer)&local_1220.displayServer.field_2;
  local_1220.displayServer._M_string_length = 0;
  local_1220.displayServer.field_2._M_local_buf[0] = '\0';
  local_1220.cropWindow.set = false;
  local_1220.pixelBounds.set = false;
  local_1220.pixelMaterial.set = false;
  local_1298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_1240._M_dataplus._M_p = (pointer)&local_1240.field_2;
  local_15e8 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1240,"error","");
  local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"cameraworld","");
  local_15f1 = false;
  local_1619 = false;
  ppcVar1 = local_15e8 + 1;
  pcVar33 = local_15e8[1];
  local_15e8 = ppcVar1;
  if (pcVar33 != (char *)0x0) {
    ppuVar2 = (undefined **)(local_e10 + 0x10);
    local_1618 = &local_1570.field_2;
    local_1610 = &local_1550.field_2;
    local_1608 = &local_1530.field_2;
    local_1600 = &local_1508.field_2;
    local_15f0 = &local_14d0.field_2;
    local_15e0 = &local_14b0.field_2;
    local_15d8 = &local_1490.field_2;
    local_15d0 = &local_1468.field_2;
    local_15c8 = &local_1448.field_2;
    local_15c0 = &local_1428.field_2;
    local_15b8 = &local_1408.field_2;
    local_15b0 = &local_13e0.field_2;
    local_15a0 = &local_13a0.field_2;
    local_1578 = &local_1380.field_2;
    local_1510 = &local_1360.field_2;
    local_1470 = &local_1338.field_2;
    local_13e8 = &local_1318.field_2;
    local_1340 = &local_1280.field_2;
    do {
      paVar32 = &local_1598.field_2;
      if (*pcVar33 == '-') {
        local_e10._8_8_ = 0;
        local_e10[0x10] = '\0';
        local_13c0._M_dataplus._M_p = (pointer)&local_13c0.field_2;
        local_13c0._M_string_length = 0;
        local_13c0.field_2._M_local_buf[0] = '\0';
        local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
        local_12f8._M_string_length = 0;
        local_12f8.field_2._M_local_buf[0] = '\0';
        local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
        local_12d8._M_string_length = 0;
        local_12d8.field_2._M_local_buf[0] = '\0';
        local_1598._M_dataplus._M_p = (pointer)paVar32;
        local_e10._0_8_ = ppuVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"cropwindow","");
        local_e38._M_unused._M_object = (void *)0x0;
        local_e38._8_8_ = 0;
        local_e20 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                    ::_M_invoke;
        local_e28 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                    ::_M_manager;
        bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_15e8,&local_1598,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e10,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_e38);
        if (local_e28 != (code *)0x0) {
          (*local_e28)(&local_e38,&local_e38,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1598._M_dataplus._M_p != paVar32) {
          operator_delete(local_1598._M_dataplus._M_p,
                          CONCAT71(local_1598.field_2._M_allocated_capacity._1_7_,
                                   local_1598.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar29) {
          local_1598._M_dataplus._M_p = (pointer)paVar32;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"pixel","");
          local_e58 = (_Any_data)(ZEXT816(0) << 0x40);
          local_e40 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                      ::_M_invoke;
          local_e48 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                      ::_M_manager;
          bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_15e8,&local_1598,&local_12f8,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_e58);
          if (local_e48 != (code *)0x0) {
            (*local_e48)(&local_e58,&local_e58,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1598._M_dataplus._M_p != paVar32) {
            operator_delete(local_1598._M_dataplus._M_p,
                            CONCAT71(local_1598.field_2._M_allocated_capacity._1_7_,
                                     local_1598.field_2._M_local_buf[0]) + 1);
          }
          if (bVar29) {
            str_00._M_str = local_12f8._M_dataplus._M_p;
            str_00._M_len = local_12f8._M_string_length;
            pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_14e8,str_00,',');
            if ((long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start == 8) {
              local_1220.pixelBounds.optionalValue._0_8_ =
                   *(undefined8 *)
                    local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
              local_1220.pixelBounds.optionalValue._8_8_ =
                   CONCAT44((int)*(pointer)((long)local_14e8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4) + 1,
                            (int)*local_14e8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
              local_1220.pixelBounds.set = true;
LAB_001d1a79:
              if ((aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
                  local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)0x0) {
                operator_delete(local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_001d1a9f;
            }
            local_1598._M_dataplus._M_p = (pointer)paVar32;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1598,"Didn\'t find two values after --pixel","");
          }
          else {
            local_1598._M_dataplus._M_p = (pointer)paVar32;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"pixelbounds","");
            local_e78 = (_Any_data)(ZEXT816(0) << 0x40);
            local_e60 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                        ::_M_invoke;
            local_e68 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                        ::_M_manager;
            bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                               (&local_15e8,&local_1598,&local_13c0,
                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                 *)&local_e78);
            if (local_e68 != (code *)0x0) {
              (*local_e68)(&local_e78,&local_e78,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1598._M_dataplus._M_p != paVar32) {
              operator_delete(local_1598._M_dataplus._M_p,
                              CONCAT71(local_1598.field_2._M_allocated_capacity._1_7_,
                                       local_1598.field_2._M_local_buf[0]) + 1);
            }
            if (bVar29) {
              str_01._M_str = local_13c0._M_dataplus._M_p;
              str_01._M_len = local_13c0._M_string_length;
              pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_14e8,str_01,',');
              if ((long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start == 0x10) {
                fVar3 = *(float *)((long)local_14e8.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start + 8);
                fVar4 = *local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                fVar5 = *(float *)((long)local_14e8.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start + 4);
                fVar6 = *(pointer)((long)local_14e8.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start + 0xc);
                fVar10 = fVar4;
                if ((int)fVar5 < (int)fVar4) {
                  fVar10 = fVar5;
                }
                fVar11 = fVar3;
                if ((int)fVar6 < (int)fVar3) {
                  fVar11 = fVar6;
                }
                if ((int)fVar5 < (int)fVar4) {
                  fVar5 = fVar4;
                }
                if ((int)fVar6 < (int)fVar3) {
                  fVar6 = fVar3;
                }
                local_1220.pixelBounds.optionalValue._0_8_ = CONCAT44(fVar11,fVar10);
                local_1220.pixelBounds.optionalValue._8_8_ = CONCAT44(fVar6,fVar5);
                local_1220.pixelBounds.set = true;
                goto LAB_001d18d2;
              }
              local_1598._M_dataplus._M_p = (pointer)paVar32;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1598,
                         "Didn\'t find four integer values after --pixelbounds","");
            }
            else {
              local_1598._M_dataplus._M_p = (pointer)paVar32;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1598,"pixelmaterial","");
              local_e98 = (_Any_data)(ZEXT816(0) << 0x40);
              local_e80 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                          ::_M_invoke;
              local_e88 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                          ::_M_manager;
              bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_15e8,&local_1598,&local_12d8,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_e98);
              if (local_e88 != (code *)0x0) {
                (*local_e88)(&local_e98,&local_e98,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1598._M_dataplus._M_p != paVar32) {
                operator_delete(local_1598._M_dataplus._M_p,
                                CONCAT71(local_1598.field_2._M_allocated_capacity._1_7_,
                                         local_1598.field_2._M_local_buf[0]) + 1);
              }
              if (bVar29) {
                str_02._M_str = local_12d8._M_dataplus._M_p;
                str_02._M_len = local_12d8._M_string_length;
                pbrt::SplitStringToInts((vector<int,_std::allocator<int>_> *)&local_14e8,str_02,',')
                ;
                if ((long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start == 8) {
                  local_1220.pixelMaterial.optionalValue =
                       *(aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
                        local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
                  local_1220.pixelMaterial.set = true;
                  goto LAB_001d1a79;
                }
              }
              else {
                local_1598._M_dataplus._M_p = (pointer)paVar32;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1598,"debugstart","");
                local_eb8 = (_Any_data)(ZEXT816(0) << 0x40);
                local_ea0 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                            ::_M_invoke;
                local_ea8 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                            ::_M_manager;
                local_15a1 = pbrt::ParseArg<std::__cxx11::string*>
                                       (&local_15e8,&local_1598,&local_1220.debugStart,
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)&local_eb8);
                if ((bool)local_15a1) {
LAB_001d1ec6:
                  bVar28 = false;
                  bVar27 = false;
                  bVar26 = false;
                  bVar25 = false;
                  bVar24 = false;
                  bVar23 = false;
                  bVar22 = false;
                  bVar21 = false;
                  bVar20 = false;
                  bVar19 = false;
                  bVar18 = false;
                  bVar17 = false;
                  bVar16 = false;
                  bVar29 = false;
LAB_001d20d5:
                  bVar15 = false;
LAB_001d20d8:
                  bVar14 = false;
LAB_001d20da:
                  local_1659 = true;
                  bVar13 = false;
                  bVar12 = false;
                }
                else {
                  local_1570._M_dataplus._M_p = (pointer)&local_1570.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1570,"disable-pixel-jitter","");
                  local_ed8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_ec0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_ec8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1570,
                                      &local_1220.super_BasicPBRTOptions.disablePixelJitter,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_ed8);
                  if (bVar29) goto LAB_001d1ec6;
                  local_1550._M_dataplus._M_p = (pointer)&local_1550.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1550,"disable-wavelength-jitter","");
                  local_ef8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_ee0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_ee8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1550,
                                      &local_1220.super_BasicPBRTOptions.disableWavelengthJitter,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_ef8);
                  if (bVar29) {
                    bVar27 = false;
LAB_001d2070:
                    bVar26 = false;
LAB_001d2078:
                    bVar25 = false;
LAB_001d2080:
                    bVar24 = false;
LAB_001d2088:
                    bVar23 = false;
LAB_001d2090:
                    bVar22 = false;
LAB_001d2098:
                    bVar21 = false;
LAB_001d20a0:
                    bVar20 = false;
LAB_001d20a8:
                    bVar19 = false;
LAB_001d20b0:
                    bVar18 = false;
LAB_001d20b8:
                    bVar17 = false;
LAB_001d20c0:
                    bVar16 = false;
LAB_001d20c8:
                    bVar29 = false;
LAB_001d20d0:
                    bVar28 = true;
                    goto LAB_001d20d5;
                  }
                  local_1530._M_dataplus._M_p = (pointer)&local_1530.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1530,"display-server","");
                  local_f18 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_f00 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_f08 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_1530,&local_1220.displayServer,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_f18);
                  if (bVar29) {
                    bVar27 = true;
                    goto LAB_001d2070;
                  }
                  local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1508,"force-diffuse","");
                  local_f38 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_f20 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_f28 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1508,
                                      &local_1220.super_BasicPBRTOptions.forceDiffuse,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_f38);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    goto LAB_001d2078;
                  }
                  local_14d0._M_dataplus._M_p = (pointer)&local_14d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14d0,"format","")
                  ;
                  local_f58 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_f40 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_f48 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_14d0,&local_15f1,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_f58);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    goto LAB_001d2080;
                  }
                  local_14b0._M_dataplus._M_p = (pointer)&local_14b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_14b0,"log-level","");
                  local_f78 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_f60 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_f68 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_14b0,&local_1240,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_f78);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    goto LAB_001d2088;
                  }
                  local_1490._M_dataplus._M_p = (pointer)&local_1490.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1490,"mse-reference-image","");
                  local_f98 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_f80 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_f88 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_1490,&local_1220.mseReferenceImage,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_f98);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    goto LAB_001d2090;
                  }
                  local_1468._M_dataplus._M_p = (pointer)&local_1468.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1468,"mse-reference-out","");
                  local_fb8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_fa0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_fa8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_1468,&local_1220.mseReferenceOutput,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_fb8);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    goto LAB_001d2098;
                  }
                  local_1448._M_dataplus._M_p = (pointer)&local_1448.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1448,"nthreads","");
                  local_fd8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_fc0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_fc8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<int*>
                                     (&local_15e8,&local_1448,&local_1220.nThreads,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_fd8);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    goto LAB_001d20a0;
                  }
                  local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1428,"outfile","");
                  local_ff8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_fe0 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_invoke;
                  local_fe8 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                              ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_1428,&local_1220.imageFile,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_ff8);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    goto LAB_001d20a8;
                  }
                  local_1408._M_dataplus._M_p = (pointer)&local_1408.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1408,"pixelstats","");
                  local_1018 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_1000 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_1008 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1408,&local_1220.recordPixelStatistics,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_1018);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    goto LAB_001d20b0;
                  }
                  local_13e0._M_dataplus._M_p = (pointer)&local_13e0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13e0,"quick","");
                  local_1038 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_1020 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_1028 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_13e0,&local_1220.quickRender,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_1038);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    goto LAB_001d20b8;
                  }
                  local_13a0._M_dataplus._M_p = (pointer)&local_13a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13a0,"quiet","");
                  local_1058 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_1040 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_1048 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_13a0,
                                      &local_1220.super_BasicPBRTOptions.quiet,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_1058);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    goto LAB_001d20c0;
                  }
                  local_1380._M_dataplus._M_p = (pointer)&local_1380.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1380,"render-coord-sys","");
                  local_1078 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_1060 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_1068 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<std::__cxx11::string*>
                                     (&local_15e8,&local_1380,&local_12b8,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_1078);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    goto LAB_001d20c8;
                  }
                  local_1360._M_dataplus._M_p = (pointer)&local_1360.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1360,"seed","");
                  local_1098 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_1080 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_1088 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<int*>
                                     (&local_15e8,&local_1360,(int *)&local_1220,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_1098);
                  if (bVar29) {
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    bVar29 = true;
                    goto LAB_001d20d0;
                  }
                  local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1338,"spp","");
                  local_10b8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_10a0 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_10a8 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<pstd::optional<int>*>
                                     (&local_15e8,&local_1338,&local_1220.pixelSamples,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_10b8);
                  if (bVar29) {
                    bVar28 = true;
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    bVar29 = true;
                    bVar15 = true;
                    goto LAB_001d20d8;
                  }
                  local_1318._M_dataplus._M_p = (pointer)&local_1318.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1318,"toply","");
                  local_10d8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_10c0 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_10c8 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1318,&local_1619,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_10d8);
                  if (bVar29) {
                    bVar28 = true;
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    bVar29 = true;
                    bVar15 = true;
                    bVar14 = true;
                    goto LAB_001d20da;
                  }
                  local_1280._M_dataplus._M_p = (pointer)&local_1280.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1280,"write-partial-images","");
                  local_10f8 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_10e0 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_invoke;
                  local_10e8 = std::
                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                               ::_M_manager;
                  bVar29 = pbrt::ParseArg<bool*>
                                     (&local_15e8,&local_1280,&local_1220.writePartialImages,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_10f8);
                  if (bVar29) {
                    bVar28 = true;
                    bVar12 = false;
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    bVar29 = true;
                    local_1659 = true;
                    bVar15 = true;
                    bVar14 = true;
                    bVar13 = true;
                  }
                  else {
                    local_1260._M_dataplus._M_p = (pointer)&local_1260.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1260,"upgrade","");
                    local_1118 = (_Any_data)(ZEXT816(0) << 0x40);
                    local_1100 = std::
                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                 ::_M_invoke;
                    local_1108 = std::
                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp:129:24)>
                                 ::_M_manager;
                    local_1659 = pbrt::ParseArg<bool*>
                                           (&local_15e8,&local_1260,&local_1220.upgrade,
                                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                             *)&local_1118);
                    bVar28 = true;
                    bVar27 = true;
                    bVar26 = true;
                    bVar25 = true;
                    bVar24 = true;
                    bVar23 = true;
                    bVar22 = true;
                    bVar21 = true;
                    bVar20 = true;
                    bVar19 = true;
                    bVar18 = true;
                    bVar17 = true;
                    bVar16 = true;
                    bVar29 = true;
                    bVar15 = true;
                    bVar14 = true;
                    bVar13 = true;
                    bVar12 = true;
                  }
                }
                if (bVar12) {
                  if (local_1108 != (code *)0x0) {
                    (*local_1108)(&local_1118,&local_1118,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
                    operator_delete(local_1260._M_dataplus._M_p,
                                    local_1260.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar13) {
                  if (local_10e8 != (code *)0x0) {
                    (*local_10e8)(&local_10f8,&local_10f8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
                    operator_delete(local_1280._M_dataplus._M_p,
                                    local_1280.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar14) {
                  if (local_10c8 != (code *)0x0) {
                    (*local_10c8)(&local_10d8,&local_10d8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1318._M_dataplus._M_p != &local_1318.field_2) {
                    operator_delete(local_1318._M_dataplus._M_p,
                                    local_1318.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar15) {
                  if (local_10a8 != (code *)0x0) {
                    (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
                    operator_delete(local_1338._M_dataplus._M_p,
                                    local_1338.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar29) {
                  if (local_1088 != (code *)0x0) {
                    (*local_1088)(&local_1098,&local_1098,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1360._M_dataplus._M_p != &local_1360.field_2) {
                    operator_delete(local_1360._M_dataplus._M_p,
                                    local_1360.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar16) {
                  if (local_1068 != (code *)0x0) {
                    (*local_1068)(&local_1078,&local_1078,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1380._M_dataplus._M_p != &local_1380.field_2) {
                    operator_delete(local_1380._M_dataplus._M_p,
                                    local_1380.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar17) {
                  if (local_1048 != (code *)0x0) {
                    (*local_1048)(&local_1058,&local_1058,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_13a0._M_dataplus._M_p != &local_13a0.field_2) {
                    operator_delete(local_13a0._M_dataplus._M_p,
                                    local_13a0.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar18) {
                  if (local_1028 != (code *)0x0) {
                    (*local_1028)(&local_1038,&local_1038,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_13e0._M_dataplus._M_p != &local_13e0.field_2) {
                    operator_delete(local_13e0._M_dataplus._M_p,
                                    local_13e0.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar19) {
                  if (local_1008 != (code *)0x0) {
                    (*local_1008)(&local_1018,&local_1018,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1408._M_dataplus._M_p != &local_1408.field_2) {
                    operator_delete(local_1408._M_dataplus._M_p,
                                    local_1408.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar20) {
                  if (local_fe8 != (code *)0x0) {
                    (*local_fe8)(&local_ff8,&local_ff8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1428._M_dataplus._M_p != &local_1428.field_2) {
                    operator_delete(local_1428._M_dataplus._M_p,
                                    local_1428.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar21) {
                  if (local_fc8 != (code *)0x0) {
                    (*local_fc8)(&local_fd8,&local_fd8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1448._M_dataplus._M_p != &local_1448.field_2) {
                    operator_delete(local_1448._M_dataplus._M_p,
                                    local_1448.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar22) {
                  if (local_fa8 != (code *)0x0) {
                    (*local_fa8)(&local_fb8,&local_fb8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
                    operator_delete(local_1468._M_dataplus._M_p,
                                    local_1468.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar23) {
                  if (local_f88 != (code *)0x0) {
                    (*local_f88)(&local_f98,&local_f98,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1490._M_dataplus._M_p != &local_1490.field_2) {
                    operator_delete(local_1490._M_dataplus._M_p,
                                    local_1490.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar24) {
                  if (local_f68 != (code *)0x0) {
                    (*local_f68)(&local_f78,&local_f78,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_14b0._M_dataplus._M_p != &local_14b0.field_2) {
                    operator_delete(local_14b0._M_dataplus._M_p,
                                    local_14b0.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar25) {
                  if (local_f48 != (code *)0x0) {
                    (*local_f48)(&local_f58,&local_f58,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_14d0._M_dataplus._M_p != &local_14d0.field_2) {
                    operator_delete(local_14d0._M_dataplus._M_p,
                                    local_14d0.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar26) {
                  if (local_f28 != (code *)0x0) {
                    (*local_f28)(&local_f38,&local_f38,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
                    operator_delete(local_1508._M_dataplus._M_p,
                                    local_1508.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar27) {
                  if (local_f08 != (code *)0x0) {
                    (*local_f08)(&local_f18,&local_f18,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
                    operator_delete(local_1530._M_dataplus._M_p,
                                    local_1530.field_2._M_allocated_capacity + 1);
                  }
                }
                if (bVar28) {
                  if (local_ee8 != (code *)0x0) {
                    (*local_ee8)(&local_ef8,&local_ef8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
                    operator_delete(local_1550._M_dataplus._M_p,
                                    local_1550.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_15a1 == '\0') {
                  if (local_ec8 != (code *)0x0) {
                    (*local_ec8)(&local_ed8,&local_ed8,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1570._M_dataplus._M_p != &local_1570.field_2) {
                    operator_delete(local_1570._M_dataplus._M_p,
                                    local_1570.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_ea8 != (code *)0x0) {
                  (*local_ea8)(&local_eb8,&local_eb8,__destroy_functor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
                  operator_delete(local_1598._M_dataplus._M_p,
                                  CONCAT71(local_1598.field_2._M_allocated_capacity._1_7_,
                                           local_1598.field_2._M_local_buf[0]) + 1);
                }
                ppcVar1 = local_15e8;
                if (local_1659 != false) goto LAB_001d1a9f;
                pcVar33 = *local_15e8;
                iVar30 = strcmp(pcVar33,"--help");
                if (((iVar30 != 0) && (iVar30 = strcmp(pcVar33,"-help"), iVar30 != 0)) &&
                   (iVar30 = strcmp(pcVar33,"-h"), iVar30 != 0)) {
                  local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
                  local_1598._M_string_length = 0;
                  local_1598.field_2._M_local_buf[0] = '\0';
                  pbrt::detail::stringPrintfRecursive<char*&>
                            (&local_1598,"argument \"%s\" unknown",ppcVar1);
                  goto LAB_001d3921;
                }
                local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
                local_1598._M_string_length = 0;
                local_1598.field_2._M_local_buf[0] = '\0';
                usage(&local_1598);
              }
              local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1598,"Didn\'t find two values after --pixelmaterial","");
            }
          }
LAB_001d3921:
          usage(&local_1598);
          goto LAB_001d392e;
        }
        str._M_str = (char *)local_e10._0_8_;
        str._M_len = local_e10._8_8_;
        pbrt::SplitStringToFloats(&local_14e8,str,',');
        if ((long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x10) {
          local_1598._M_dataplus._M_p = (pointer)paVar32;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1598,"Didn\'t find four values after --cropwindow","");
          goto LAB_001d3921;
        }
        auVar8 = vminss_avx(ZEXT416((uint)*(pointer)((long)local_14e8.
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4)),
                            ZEXT416((uint)*local_14e8.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start));
        auVar9 = vminss_avx(ZEXT416((uint)*(pointer)((long)local_14e8.
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 0xc)),
                            ZEXT416((uint)((aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>
                                            *)((long)local_14e8.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8))->
                                          __align));
        auVar8 = vinsertps_avx(auVar8,auVar9,0x10);
        auVar9 = vmaxss_avx(ZEXT416((uint)*(pointer)((long)local_14e8.
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4)),
                            ZEXT416((uint)*local_14e8.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start));
        auVar7 = vmaxss_avx(ZEXT416((uint)*(pointer)((long)local_14e8.
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 0xc)),
                            ZEXT416((uint)((aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>
                                            *)((long)local_14e8.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 8))->
                                          __align));
        auVar9 = vinsertps_avx(auVar9,auVar7,0x10);
        local_1220.cropWindow.optionalValue =
             (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
             vmovlhps_avx(auVar8,auVar9);
        local_1220.cropWindow.set = true;
LAB_001d18d2:
        if ((aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
            local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)0x0) {
          operator_delete(local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_14e8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
LAB_001d1a9f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
          operator_delete(local_12d8._M_dataplus._M_p,
                          CONCAT71(local_12d8.field_2._M_allocated_capacity._1_7_,
                                   local_12d8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
          operator_delete(local_12f8._M_dataplus._M_p,
                          CONCAT71(local_12f8.field_2._M_allocated_capacity._1_7_,
                                   local_12f8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_13c0._M_dataplus._M_p != &local_13c0.field_2) {
          operator_delete(local_13c0._M_dataplus._M_p,
                          CONCAT71(local_13c0.field_2._M_allocated_capacity._1_7_,
                                   local_13c0.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined **)local_e10._0_8_ != ppuVar2) {
          operator_delete((void *)local_e10._0_8_,
                          CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) + 1);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e10,*local_15e8,(allocator<char> *)&local_13c0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10);
        if ((undefined **)local_e10._0_8_ != ppuVar2) {
          operator_delete((void *)local_e10._0_8_,
                          CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) + 1);
        }
        local_15e8 = local_15e8 + 1;
      }
      pcVar33 = *local_15e8;
    } while (pcVar33 != (char *)0x0);
  }
  if (((local_1220.super_BasicPBRTOptions.quiet == false) && (local_15f1 == false)) &&
     ((local_1619 == false && (local_1220.upgrade == false)))) {
    printf("pbrt version 4 (built %s at %s)\n","May  2 2025","20:19:49");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  iVar30 = std::__cxx11::string::compare((char *)&local_12b8);
  if (iVar30 == 0) {
    sVar31 = 0;
  }
  else {
    iVar30 = std::__cxx11::string::compare((char *)&local_12b8);
    if (iVar30 == 0) {
      sVar31 = 1;
    }
    else {
      iVar30 = std::__cxx11::string::compare((char *)&local_12b8);
      sVar31 = 2;
      if (iVar30 != 0) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&local_12b8);
      }
    }
  }
  local_1220.super_BasicPBRTOptions.renderingSpace = (RenderingCoordinateSystem)sVar31;
  if ((local_1220.mseReferenceImage._M_string_length == 0) ||
     (local_1220.mseReferenceOutput._M_string_length != 0)) {
    if ((local_1220.mseReferenceImage._M_string_length != 0) ||
       (local_1220.mseReferenceOutput._M_string_length == 0)) {
      if ((local_1220.pixelMaterial.set == true) &&
         (local_1220.super_BasicPBRTOptions.useGPU == true)) {
        local_e10._8_8_ = 0;
        local_e10[0x10] = '\0';
        local_e10._0_8_ = local_e10 + 0x10;
        pbrt::detail::stringPrintfRecursive
                  ((string *)local_e10,"Disabling --use-gpu since --pixelmaterial was specified.");
        pbrt::Warning((FileLoc *)0x0,(char *)local_e10._0_8_);
        if ((undefined1 *)local_e10._0_8_ != local_e10 + 0x10) {
          operator_delete((void *)local_e10._0_8_,
                          CONCAT62(local_e10._18_6_,CONCAT11(local_e10[0x11],local_e10[0x10])) + 1);
        }
        local_1220.super_BasicPBRTOptions.useGPU = false;
      }
      local_1220.logLevel = pbrt::LogLevelFromString(&local_1240);
      pbrt::InitPBRT(&local_1220);
      if (((local_15f1 == false) && (local_1619 == false)) && (local_1220.upgrade != true)) {
        pbrt::ParsedScene::ParsedScene((ParsedScene *)local_e10);
        filenames_01.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_1298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        filenames_01.n = sVar31;
        pbrt::ParseFiles((pbrt *)local_e10,
                         (SceneRepresentation *)
                         local_1298.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_01);
        if (local_1220.super_BasicPBRTOptions.useGPU == true) {
LAB_001d392e:
          pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
        }
        pbrt::CPURender((ParsedScene *)local_e10);
        if (pbrt::LOGGING_LogLevel < 1) {
          local_12f8._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
          local_13c0._M_string_length = 0;
          local_13c0.field_2._M_local_buf[0] = '\0';
          local_13c0._M_dataplus._M_p = (pointer)&local_13c0.field_2;
          pbrt::detail::stringPrintfRecursive<unsigned_long>
                    (&local_13c0,"Memory used after post-render cleanup: %s",
                     (unsigned_long *)&local_12f8);
          pbrt::Log(Verbose,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/pbrt.cpp"
                    ,0x101,local_13c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_13c0._M_dataplus._M_p != &local_13c0.field_2) {
            operator_delete(local_13c0._M_dataplus._M_p,
                            CONCAT71(local_13c0.field_2._M_allocated_capacity._1_7_,
                                     local_13c0.field_2._M_local_buf[0]) + 1);
          }
        }
        pbrt::CleanupPBRT();
        pbrt::ParsedScene::~ParsedScene((ParsedScene *)local_e10);
      }
      else {
        filenames_00.n._1_7_ = (undefined7)(sVar31 >> 8);
        filenames_00.n._0_1_ = local_1220.upgrade;
        local_de0.memoryResource = (memory_resource *)&local_df0;
        local_e10._0_8_ = &PTR_Scale_02dac798;
        local_e10._8_8_ = ((ulong)local_e10._8_8_ >> 8 & 0xffffff) << 8;
        local_e10[0x10] = local_1619;
        local_e10[0x11] = local_1220.upgrade;
        local_df0._M_allocated_capacity._0_4_ = 0;
        local_df0._8_8_ = 0;
        local_dd0._0_8_ = (ParsedParameter *)0x0;
        local_dd0._32_8_ = local_dd0 + 0x10;
        local_dd0._16_4_ = _S_red;
        local_dd0._24_8_ = (ParsedParameter *)0x0;
        local_dd0._48_8_ = (ParsedParameter *)0x0;
        local_d90._16_8_ = local_d90;
        local_d90._0_4_ = _S_red;
        local_d90._8_8_ = (_Base_ptr)0x0;
        local_d90._32_8_ = (char *)0x0;
        local_d60._16_8_ = local_d60;
        local_d60._0_4_ = _S_red;
        local_d60._8_8_ = (_Base_ptr)0x0;
        local_d40.memoryResource = (memory_resource *)0x0;
        filenames_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_1298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1298.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        local_dd8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_de0.memoryResource;
        local_dd0._40_8_ = local_dd0._32_8_;
        local_d90._24_8_ = local_d90._16_8_;
        local_d60._24_8_ = local_d60._16_8_;
        pbrt::ParseFiles((pbrt *)local_e10,
                         (SceneRepresentation *)
                         local_1298.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_00);
        pbrt::FormattingScene::~FormattingScene((FormattingScene *)local_e10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
        operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1240._M_dataplus._M_p != &local_1240.field_2) {
        operator_delete(local_1240._M_dataplus._M_p,local_1240.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1298);
      if (local_1220.pixelMaterial.set == true) {
        local_1220.pixelMaterial.set = false;
      }
      if (local_1220.pixelBounds.set == true) {
        local_1220.pixelBounds.set = false;
      }
      if (local_1220.cropWindow.set == true) {
        local_1220.cropWindow.set = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.displayServer._M_dataplus._M_p != &local_1220.displayServer.field_2) {
        operator_delete(local_1220.displayServer._M_dataplus._M_p,
                        CONCAT71(local_1220.displayServer.field_2._M_allocated_capacity._1_7_,
                                 local_1220.displayServer.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.debugStart._M_dataplus._M_p != &local_1220.debugStart.field_2) {
        operator_delete(local_1220.debugStart._M_dataplus._M_p,
                        CONCAT71(local_1220.debugStart.field_2._M_allocated_capacity._1_7_,
                                 local_1220.debugStart.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.mseReferenceOutput._M_dataplus._M_p !=
          &local_1220.mseReferenceOutput.field_2) {
        operator_delete(local_1220.mseReferenceOutput._M_dataplus._M_p,
                        CONCAT71(local_1220.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                                 local_1220.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.mseReferenceImage._M_dataplus._M_p != &local_1220.mseReferenceImage.field_2)
      {
        operator_delete(local_1220.mseReferenceImage._M_dataplus._M_p,
                        CONCAT71(local_1220.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                                 local_1220.mseReferenceImage.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1220.imageFile._M_dataplus._M_p != &local_1220.imageFile.field_2) {
        operator_delete(local_1220.imageFile._M_dataplus._M_p,
                        CONCAT71(local_1220.imageFile.field_2._M_allocated_capacity._1_7_,
                                 local_1220.imageFile.field_2._M_local_buf[0]) + 1);
      }
      return 0;
    }
    pcVar33 = "Must provide MSE reference image via --mse-reference-image";
  }
  else {
    pcVar33 = "Must provide MSE reference output filename via --mse-reference-out";
  }
  pbrt::ErrorExit<>(pcVar33);
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel, pixelMaterial;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            std::vector<Float> c = SplitStringToFloats(cropWindow, ',');
            if (c.size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow = Bounds2f(Point2f(c[0], c[2]), Point2f(c[1], c[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            std::vector<int> p = SplitStringToInts(pixel, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i(p[0], p[1]), Point2i(p[0] + 1, p[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            std::vector<int> p = SplitStringToInts(pixelBounds, ',');
            if (p.size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds = Bounds2i(Point2i(p[0], p[2]), Point2i(p[1], p[3]));
        } else if (ParseArg(&argv, "pixelmaterial", &pixelMaterial, onError)) {
            std::vector<int> p = SplitStringToInts(pixelMaterial, ',');
            if (p.size() != 2) {
                usage("Didn't find two values after --pixelmaterial");
                return 1;
            }
            options.pixelMaterial = Point2i(p[0], p[1]);
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "write-partial-images", &options.writePartialImages,
                     onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifdef PBRT_DEBUG_BUILD
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    if (options.pixelMaterial && options.useGPU) {
        Warning("Disabling --use-gpu since --pixelmaterial was specified.");
        options.useGPU = false;
    }

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}